

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetailedFormatter.h
# Opt level: O3

string * __thiscall
SLogLib::DetailedFormatter::formatMessage_abi_cxx11_
          (string *__return_storage_ptr__,DetailedFormatter *this,Message *msg)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  CallInfo _callInfo1;
  CallInfo _callInfo;
  ostringstream _stream;
  char *local_238;
  long local_230;
  char local_228 [16];
  char *local_218;
  long local_210;
  char local_208 [16];
  undefined4 local_1f8;
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  undefined4 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar6 = *(long *)(*(long *)(msg + 0x38) + 8);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,*(long *)(lVar6 + -0x48),
             *(long *)(lVar6 + -0x40) + *(long *)(lVar6 + -0x48));
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,*(long *)(lVar6 + -0x28),
             *(long *)(lVar6 + -0x20) + *(long *)(lVar6 + -0x28));
  local_1b0 = *(undefined4 *)(lVar6 + -8);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Msg Level  : ",0xd);
  plVar2 = (long *)std::ostream::operator<<((ostream *)local_1a8,*(int *)(msg + 0x30));
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Time       : ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Process ID : ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Thread ID  : ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"FileName   : ",0xd);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1f0,local_1e8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"FuncName   : ",0xd);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1d0,local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Line No.   : ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"CallStack  : ",0xd);
  lVar6 = **(long **)(msg + 0x38);
  if ((*(long **)(msg + 0x38))[1] != lVar6) {
    lVar4 = 0x40;
    uVar5 = 0;
    do {
      lVar1 = *(long *)(lVar6 + -0x40 + lVar4);
      local_238 = local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,lVar1,*(long *)(lVar6 + -0x38 + lVar4) + lVar1);
      lVar1 = *(long *)(lVar6 + -0x20 + lVar4);
      local_218 = local_208;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,lVar1,*(long *)(lVar6 + -0x18 + lVar4) + lVar1);
      local_1f8 = *(undefined4 *)(lVar6 + lVar4);
      if (uVar5 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"             ",0xd)
        ;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_238,local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_218,local_210);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [",2);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_218 != local_208) {
        operator_delete(local_218);
      }
      if (local_238 != local_228) {
        operator_delete(local_238);
      }
      uVar5 = uVar5 + 1;
      lVar6 = **(long **)(msg + 0x38);
      lVar4 = lVar4 + 0x48;
    } while (uVar5 < (ulong)(((*(long **)(msg + 0x38))[1] - lVar6 >> 3) * -0x71c71c71c71c71c7));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Message    : ",0xd);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,*(char **)msg,*(long *)(msg + 8));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string formatMessage(const Message& msg) const override
	{
		size_t         _size     = msg.mCallStack->size();
		const CallInfo _callInfo = (*msg.mCallStack)[_size-1];
		
		std::ostringstream _stream;
		_stream << "Msg Level  : " << toInteger(msg.mLevel)       << std::endl;
		_stream << "Time       : " << msg.mDateTime.mYear         << "-"
								   << msg.mDateTime.mMonth        << "-"
								   << msg.mDateTime.mDay          << " "
								   << msg.mDateTime.mHour         << ":"
								   << msg.mDateTime.mMinute       << ":"
								   << msg.mDateTime.mSecond       << ":"
								   << msg.mDateTime.mMilliseconds << std::endl;
		_stream << "Process ID : " << msg.mProcessId              << std::endl;
		_stream << "Thread ID  : " << msg.mThreadId               << std::endl;
		_stream << "FileName   : " << _callInfo.mFileName         << std::endl;
		_stream << "FuncName   : " << _callInfo.mFuncName         << std::endl;
		_stream << "Line No.   : " << _callInfo.mLineNumber       << std::endl;
		_stream << "CallStack  : ";
		
		for(size_t i=0 ; i<msg.mCallStack->size() ; ++i)
		{
			const CallInfo _callInfo1 = (*msg.mCallStack)[i];
			
			if(i==0)
			{
				_stream << _callInfo1.mFileName;
			}
			else
			{
				_stream << "             " << _callInfo1.mFileName;
			}
			_stream << " : " << _callInfo1.mFuncName;
			_stream << " [" << _callInfo1.mLineNumber << "]" << std::endl;
		}
		
		_stream << "Message    : " << msg.mUserMessage << std::endl << std::endl;
		return _stream.str();
	}